

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filtration_value_utils.h
# Opt level: O2

bool Gudhi::intersect_lifetimes<float>(float *f1,float *f2)

{
  float fVar1;
  
  fVar1 = *f2;
  if (NAN(*f1)) {
    *f1 = fVar1;
    return !NAN(fVar1);
  }
  if (*f1 < fVar1) {
    *f1 = fVar1;
    return true;
  }
  return false;
}

Assistant:

bool intersect_lifetimes(Arithmetic_filtration_value& f1, const Arithmetic_filtration_value& f2)
{
  if constexpr (std::numeric_limits<Arithmetic_filtration_value>::has_quiet_NaN) {
    if (std::isnan(f1)) {
      f1 = f2;
      return !std::isnan(f2);
    }

    // Computes the max while handling NaN as lowest value.
    if (!(f1 < f2)) return false;

    f1 = f2;
    return true;
  } else {
    // NaN not possible.
    if (f1 < f2){
      f1 = f2;
      return true;
    }
    return false;
  }
}